

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwr.c
# Opt level: O2

void set_ow_zone(dw_rom *rom,uint8_t x,uint8_t y,uint8_t value)

{
  uint8_t *puVar1;
  byte bVar2;
  byte bVar3;
  
  if ((y | x) < 8) {
    bVar2 = (byte)(y << 3 | x) >> 1;
    puVar1 = rom->zone_layout;
    if ((x & 1) == 0) {
      puVar1[bVar2] = puVar1[bVar2] & 0xf;
      bVar3 = value << 4;
    }
    else {
      puVar1[bVar2] = puVar1[bVar2] & 0xf0;
      bVar3 = value & 0xf;
    }
    rom->zone_layout[bVar2] = rom->zone_layout[bVar2] | bVar3;
  }
  return;
}

Assistant:

static inline void set_ow_zone(dw_rom *rom, uint8_t x, uint8_t y, uint8_t value)
{
    int zone_index;

    if (x > 7 || y > 7)  /* ignore anything out of bounds. */
        return;

    zone_index = x + 8 * y;
    if (zone_index & 1) {
        rom->zone_layout[zone_index / 2] &= 0xf0;  /* second nybble */
        rom->zone_layout[zone_index / 2] |= (0xf & value);
    } else {
        rom->zone_layout[zone_index / 2] &= 0xf; /* first nybble */
        rom->zone_layout[zone_index / 2] |= (0xf0 & (value << 4));
    }
}